

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,RangeValue *min,RangeValue *max)

{
  ulong uVar1;
  undefined7 uVar2;
  size_t sVar3;
  runtime_error *prVar4;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  uVar2 = *(undefined7 *)&min->field_0x1;
  sVar3 = min->_val;
  (this->_minimum)._isUnbound = min->_isUnbound;
  *(undefined7 *)&(this->_minimum).field_0x1 = uVar2;
  (this->_minimum)._val = sVar3;
  uVar2 = *(undefined7 *)&max->field_0x1;
  sVar3 = max->_val;
  (this->_maximum)._isUnbound = max->_isUnbound;
  *(undefined7 *)&(this->_maximum).field_0x1 = uVar2;
  (this->_maximum)._val = sVar3;
  if (min->_isUnbound == false) {
    if (max->_isUnbound == false) {
      uVar1 = min->_val;
      sVar3 = RangeValue::value(max);
      if (sVar3 < uVar1) goto LAB_00281d65;
    }
    if (min->_isUnbound != true) {
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"Constructing invalid ShapeRange unbound minimum value.",0x36);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,asStack_1c8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00281d65:
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Constructing invalid ShapeRange with ",0x25);
  ::operator<<(local_198,min);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,", ",2);
  ::operator<<(local_198,max);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,asStack_1c8);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange::ShapeRange(const RangeValue& min, const RangeValue& max)
:
_minimum(min),
_maximum(max)
{
    if (min > max)
    {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange with " << min << ", " << max;
        throw std::runtime_error(ss.str());
    }
    if (min.isUnbound()) {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange unbound minimum value.";
        throw std::runtime_error(ss.str());
    }
}